

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void __thiscall
ear::PolarPointSourcePanner::PolarPointSourcePanner
          (PolarPointSourcePanner *this,
          vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
          *regions,optional<int> numberOfChannels)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference_type piVar4;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  *regions_local;
  PolarPointSourcePanner *this_local;
  optional<int> numberOfChannels_local;
  
  this_local = (PolarPointSourcePanner *)numberOfChannels.super_type;
  PointSourcePanner::PointSourcePanner(&this->super_PointSourcePanner);
  (this->super_PointSourcePanner)._vptr_PointSourcePanner = (_func_int **)&PTR_handle_003ba888;
  std::
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ::vector(&this->_regions,regions);
  bVar1 = boost::optional<int>::operator!((optional<int> *)&this_local);
  if (bVar1) {
    iVar2 = _numberOfRequiredChannels(this);
    this->_numberOfOutputChannels = iVar2;
  }
  else {
    piVar4 = boost::optional<int>::get((optional<int> *)&this_local);
    this->_numberOfOutputChannels = *piVar4;
    iVar2 = this->_numberOfOutputChannels;
    iVar3 = _numberOfRequiredChannels(this);
    _assert_impl(iVar3 <= iVar2,"not enough output channels in PolarPointSourcePanner");
  }
  return;
}

Assistant:

PolarPointSourcePanner::PolarPointSourcePanner(
      std::vector<std::unique_ptr<RegionHandler>> regions,
      boost::optional<int> numberOfChannels)
      : _regions(std::move(regions)) {
    if (!numberOfChannels) {
      _numberOfOutputChannels = _numberOfRequiredChannels();
    } else {
      _numberOfOutputChannels = numberOfChannels.get();
      ear_assert(_numberOfOutputChannels >= _numberOfRequiredChannels(),
                 "not enough output channels in PolarPointSourcePanner");
    }
  }